

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_param_list(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  int local_88;
  int param_counter;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string kind;
  string type;
  string name;
  Parser *this_local;
  
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t<param_list>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(kind.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"ARG",&local_71);
  std::allocator<char>::~allocator(&local_71);
  local_88 = 0;
  do {
    bVar1 = Tokenizer::type_exists(this->tokenizer,&this->cur_token);
    if (!bVar1 && local_88 < 1) break;
    if (0 < local_88) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,",",&local_a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"identifier",&local_d1)
      ;
      check_expected_x_after_y(this,&local_a8,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      poVar2 = (ostream *)this->out_file;
      std::operator+(&local_118,"\t\t\t<symbol>",&this->cur_token);
      std::operator+(&local_f8,&local_118,"</symbol>");
      poVar2 = std::operator<<(poVar2,(string *)&local_f8);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      query_tokenizer(this);
    }
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_158,"\t\t\t<keyword>",&this->cur_token);
    std::operator+(&local_138,&local_158,"</keyword>");
    poVar2 = std::operator<<(poVar2,(string *)&local_138);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::operator=
              ((string *)(kind.field_2._M_local_buf + 8),(string *)&this->cur_token);
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"IDENTIFIER",&local_179)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"type",&local_1a1);
    check_token_type_x_after_y(this,&local_178,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_1e8,"\t\t\t<identifier>",&this->cur_token);
    std::operator+(&local_1c8,&local_1e8,"</identifier>");
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    Symbol_Table::set_data
              (&this->symbol_table,&this->cur_token,(string *)((long)&kind.field_2 + 8),
               (string *)local_70);
    query_tokenizer(this);
    local_88 = local_88 + 1;
    Tokenizer::get_current_token_abi_cxx11_(&local_208,this->tokenizer);
    bVar1 = std::operator==(&local_208,")");
    std::__cxx11::string::~string((string *)&local_208);
  } while (!bVar1);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t</param_list>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Symbol_Table::set_temp_arg_count(&this->symbol_table,local_88);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(kind.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Parser::parse_param_list() {
    out_file << "\t\t<param_list>" << std::endl;
    std::string name, type, kind = "ARG";


    int param_counter = 0;
    while(tokenizer.type_exists(cur_token) || param_counter > 0) {

        if (param_counter > 0) {
            check_expected_x_after_y(",", "identifier");
            out_file <<"\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
            query_tokenizer();
        }

        out_file << "\t\t\t<keyword>" + cur_token + "</keyword>" << std::endl;
        type = cur_token;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", "type");
        out_file << "\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        symbol_table.set_data(cur_token, type, kind);
        query_tokenizer();
        param_counter++;

        if (tokenizer.get_current_token() == ")") {
            break;
        }
    }

    out_file << "\t\t</param_list>" << std::endl;
    symbol_table.set_temp_arg_count(param_counter);
}